

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 SyMemBackendFree(SyMemBackend *pBackend,void *pChunk)

{
  sxi32 sVar1;
  SyMutexMethods *in_RAX;
  
  if (pChunk != (void *)0x0) {
    if ((pBackend->pMutexMethods != (SyMutexMethods *)0x0) && (pBackend->pMutex != (SyMutex *)0x0))
    {
      (*pBackend->pMutexMethods->xEnter)(pBackend->pMutex);
    }
    MemBackendFree(pBackend,pChunk);
    in_RAX = pBackend->pMutexMethods;
    if ((in_RAX != (SyMutexMethods *)0x0) && (pBackend->pMutex != (SyMutex *)0x0)) {
      sVar1 = (*in_RAX->xLeave)(pBackend->pMutex);
      return sVar1;
    }
  }
  return (sxi32)in_RAX;
}

Assistant:

JX9_PRIVATE sxi32 SyMemBackendFree(SyMemBackend *pBackend, void * pChunk)
{
	sxi32 rc;
#if defined(UNTRUST)
	if( SXMEM_BACKEND_CORRUPT(pBackend) ){
		return SXERR_CORRUPT;
	}
#endif
	if( pChunk == 0 ){
		return SXRET_OK;
	}
	if( pBackend->pMutexMethods ){
		SyMutexEnter(pBackend->pMutexMethods, pBackend->pMutex);
	}
	rc = MemBackendFree(&(*pBackend), pChunk);
	if( pBackend->pMutexMethods ){
		SyMutexLeave(pBackend->pMutexMethods, pBackend->pMutex);
	}
	return rc;
}